

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O2

bool QMainWindowLayout::needsPlatformDrag(void)

{
  undefined1 uVar1;
  int iVar2;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (needsPlatformDrag()::wayland == '\0') {
    iVar2 = __cxa_guard_acquire(&needsPlatformDrag()::wayland);
    if (iVar2 != 0) {
      QGuiApplication::platformName();
      uVar1 = QString::startsWith((QLatin1String *)&local_30,7);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_30);
      needsPlatformDrag::wayland = (bool)uVar1;
      __cxa_guard_release(&needsPlatformDrag()::wayland);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return needsPlatformDrag::wayland;
  }
  __stack_chk_fail();
}

Assistant:

bool QMainWindowLayout::needsPlatformDrag()
{
    static const bool wayland =
            QGuiApplication::platformName().startsWith("wayland"_L1, Qt::CaseInsensitive);
    return wayland;
}